

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuResource.hpp
# Opt level: O2

void __thiscall tcu::Resource::~Resource(Resource *this)

{
  this->_vptr_Resource = (_func_int **)&PTR__Resource_003e1a08;
  std::__cxx11::string::~string((string *)&this->m_name);
  return;
}

Assistant:

virtual				~Resource		(void) {}